

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressBlock_doubleFast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *puVar5;
  BYTE *pBVar6;
  undefined8 *puVar7;
  uint uVar8;
  uint uVar9;
  BYTE *pBVar10;
  U32 *pUVar11;
  U32 *pUVar12;
  BYTE *pBVar13;
  bool bVar14;
  undefined8 uVar15;
  BYTE *pStart;
  ulong *puVar16;
  ulong *puVar17;
  seqDef *psVar18;
  byte bVar19;
  byte bVar20;
  uint uVar21;
  int *piVar22;
  uint uVar23;
  ulong uVar24;
  ulong *puVar25;
  int iVar26;
  uint uVar27;
  ulong *puVar28;
  ulong *puVar29;
  ulong *puVar30;
  uint uVar31;
  U32 UVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  uint uVar36;
  ulong *puVar37;
  uint uVar38;
  ulong uVar39;
  ulong uVar40;
  long lVar41;
  int iVar42;
  BYTE *litEnd_1;
  BYTE *litEnd;
  ulong *puVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w;
  BYTE *prefixLowest;
  BYTE *base;
  BYTE *iend;
  U32 *hashLong;
  BYTE *ilimit;
  BYTE *pInLoopLimit_3;
  U32 *hashSmall;
  U32 prefixLowestIndex;
  
  pBVar10 = (ms->window).base;
  puVar5 = (ulong *)((long)src + srcSize);
  iVar42 = (int)pBVar10;
  iVar26 = (int)puVar5 - iVar42;
  uVar36 = (ms->window).dictLimit;
  uVar38 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar23 = iVar26 - uVar38;
  if (iVar26 - uVar36 <= uVar38) {
    uVar23 = uVar36;
  }
  if (ms->loadedDictEnd != 0) {
    uVar23 = uVar36;
  }
  puVar28 = (ulong *)(pBVar10 + uVar23);
  puVar43 = (ulong *)((long)src + (ulong)(puVar28 == (ulong *)src));
  iVar26 = (int)puVar43 - iVar42;
  uVar31 = iVar26 - uVar38;
  if (iVar26 - uVar36 <= uVar38) {
    uVar31 = uVar36;
  }
  if (ms->loadedDictEnd != 0) {
    uVar31 = uVar36;
  }
  uVar36 = rep[1];
  uVar31 = iVar26 - uVar31;
  uVar38 = uVar36;
  if (uVar31 < uVar36) {
    uVar38 = 0;
  }
  uVar44 = (ulong)uVar38;
  puVar16 = (ulong *)((long)src + (srcSize - 8));
  uVar8 = *rep;
  uVar21 = 0;
  if (uVar8 <= uVar31) {
    uVar21 = uVar8;
  }
  uVar45 = (ulong)uVar21;
  puVar29 = (ulong *)((long)src + (ulong)(puVar28 == (ulong *)src) + 1);
  uVar9 = (ms->cParams).minMatch;
  pUVar11 = ms->hashTable;
  pUVar12 = ms->chainTable;
  if (uVar9 == 5) {
    if (puVar29 <= puVar16) {
      bVar19 = 0x40 - (char)(ms->cParams).hashLog;
      bVar20 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar5 - 7);
      puVar2 = (ulong *)((long)puVar5 - 3);
      puVar3 = (ulong *)((long)puVar5 - 1);
      puVar4 = puVar5 + -4;
LAB_018f82ec:
      uVar38 = (uint)uVar44;
      uVar33 = *puVar43 * -0x30e44323485a9b9d >> (bVar19 & 0x3f);
      puVar25 = puVar43 + 0x20;
      uVar35 = (ulong)pUVar11[uVar33];
      puVar37 = (ulong *)(pBVar10 + uVar35);
      uVar21 = (uint)uVar45;
      lVar41 = -uVar45;
      uVar46 = 1;
      uVar39 = *puVar43;
      while( true ) {
        puVar17 = puVar29;
        uVar24 = uVar39 * -0x30e4432345000000 >> (bVar20 & 0x3f);
        uVar9 = pUVar12[uVar24];
        uVar40 = (ulong)uVar9;
        iVar26 = (int)puVar43;
        UVar32 = iVar26 - iVar42;
        pUVar12[uVar24] = UVar32;
        pUVar11[uVar33] = UVar32;
        if ((uVar21 != 0) && (*(int *)((long)puVar43 + lVar41 + 1) == *(int *)((long)puVar43 + 1)))
        {
          puVar29 = (ulong *)((long)puVar43 + 5);
          puVar37 = (ulong *)((long)puVar43 + lVar41 + 5);
          puVar25 = puVar29;
          if (puVar1 <= puVar29) goto LAB_018f8663;
          if (*puVar37 != *puVar29) {
            uVar39 = *puVar29 ^ *puVar37;
            uVar45 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
              }
            }
            uVar39 = uVar45 >> 3 & 0x1fffffff;
            goto LAB_018f86aa;
          }
          lVar34 = 0;
          goto LAB_018f8458;
        }
        uVar24 = *puVar17;
        uVar33 = uVar24 * -0x30e44323485a9b9d >> (bVar19 & 0x3f);
        if ((uVar23 < (uint)uVar35) && (*puVar37 == uVar39)) {
          puVar29 = puVar43 + 1;
          puVar25 = puVar37 + 1;
          puVar30 = puVar29;
          if (puVar1 <= puVar29) goto LAB_018f8a55;
          if (*puVar25 != *puVar29) {
            uVar39 = *puVar29 ^ *puVar25;
            uVar44 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
              }
            }
            uVar44 = uVar44 >> 3 & 0x1fffffff;
            goto LAB_018f8aa1;
          }
          lVar41 = 0;
          goto LAB_018f84d0;
        }
        uVar35 = (ulong)pUVar11[uVar33];
        puVar37 = (ulong *)(pBVar10 + uVar35);
        if ((uVar23 < uVar9) && (piVar22 = (int *)(pBVar10 + uVar40), *piVar22 == (int)*puVar43))
        break;
        if (puVar25 <= puVar17) {
          uVar46 = uVar46 + 1;
          puVar25 = puVar25 + 0x20;
        }
        puVar29 = (ulong *)((long)puVar17 + uVar46);
        uVar39 = uVar24;
        puVar43 = puVar17;
        if (puVar16 < (ulong *)((long)puVar17 + uVar46)) goto LAB_018f8d8d;
      }
      if ((uVar23 < pUVar11[uVar33]) && (*puVar37 == uVar24)) {
        puVar43 = puVar17 + 1;
        puVar29 = puVar37 + 1;
        puVar25 = puVar43;
        if (puVar43 < puVar1) {
          if (*puVar29 == *puVar43) {
            lVar41 = 0;
            do {
              puVar29 = (ulong *)((long)puVar17 + lVar41 + 0x10);
              if (puVar1 <= puVar29) {
                puVar29 = (ulong *)(pBVar10 + lVar41 + uVar35 + 0x10);
                puVar25 = (ulong *)((long)puVar17 + lVar41 + 0x10);
                goto LAB_018f8bdd;
              }
              lVar34 = lVar41 + uVar35 + 0x10;
              uVar44 = *puVar29;
              lVar41 = lVar41 + 8;
            } while (*(ulong *)(pBVar10 + lVar34) == uVar44);
            uVar44 = uVar44 ^ *(ulong *)(pBVar10 + lVar34);
            uVar39 = 0;
            if (uVar44 != 0) {
              for (; (uVar44 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
              }
            }
            uVar44 = (uVar39 >> 3 & 0x1fffffff) + lVar41;
          }
          else {
            uVar39 = *puVar43 ^ *puVar29;
            uVar44 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
              }
            }
            uVar44 = uVar44 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_018f8bdd:
          if ((puVar25 < puVar2) && ((int)*puVar29 == (int)*puVar25)) {
            puVar25 = (ulong *)((long)puVar25 + 4);
            puVar29 = (ulong *)((long)puVar29 + 4);
          }
          if ((puVar25 < puVar3) && ((short)*puVar29 == (short)*puVar25)) {
            puVar25 = (ulong *)((long)puVar25 + 2);
            puVar29 = (ulong *)((long)puVar29 + 2);
          }
          if (puVar25 < puVar5) {
            puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar29 == (char)*puVar25));
          }
          uVar44 = (long)puVar25 - (long)puVar43;
        }
        lVar41 = uVar44 + 8;
        uVar21 = (int)puVar17 - (int)puVar37;
        puVar43 = puVar17;
        if (src < puVar17) {
          puVar29 = (ulong *)(pBVar10 + (uVar35 - 1));
          do {
            puVar25 = (ulong *)((long)puVar43 + -1);
            if ((*(char *)puVar25 != (char)*puVar29) ||
               (lVar41 = lVar41 + 1, puVar43 = puVar25, puVar25 <= src)) break;
            bVar14 = puVar28 < puVar29;
            puVar29 = (ulong *)((long)puVar29 + -1);
          } while (bVar14);
        }
      }
      else {
        puVar29 = (ulong *)((long)puVar43 + 4);
        puVar25 = (ulong *)(piVar22 + 1);
        puVar37 = puVar29;
        if (puVar29 < puVar1) {
          if (*puVar25 == *puVar29) {
            lVar41 = 0;
            do {
              puVar25 = (ulong *)((long)puVar43 + lVar41 + 0xc);
              if (puVar1 <= puVar25) {
                puVar25 = (ulong *)(pBVar10 + lVar41 + uVar40 + 0xc);
                puVar37 = (ulong *)((long)puVar43 + lVar41 + 0xc);
                goto LAB_018f8b16;
              }
              lVar34 = lVar41 + uVar40 + 0xc;
              uVar44 = *puVar25;
              lVar41 = lVar41 + 8;
            } while (*(ulong *)(pBVar10 + lVar34) == uVar44);
            uVar44 = uVar44 ^ *(ulong *)(pBVar10 + lVar34);
            uVar39 = 0;
            if (uVar44 != 0) {
              for (; (uVar44 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
              }
            }
            uVar44 = (uVar39 >> 3 & 0x1fffffff) + lVar41;
          }
          else {
            uVar39 = *puVar29 ^ *puVar25;
            uVar44 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
              }
            }
            uVar44 = uVar44 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_018f8b16:
          if ((puVar37 < puVar2) && ((int)*puVar25 == (int)*puVar37)) {
            puVar37 = (ulong *)((long)puVar37 + 4);
            puVar25 = (ulong *)((long)puVar25 + 4);
          }
          if ((puVar37 < puVar3) && ((short)*puVar25 == (short)*puVar37)) {
            puVar37 = (ulong *)((long)puVar37 + 2);
            puVar25 = (ulong *)((long)puVar25 + 2);
          }
          if (puVar37 < puVar5) {
            puVar37 = (ulong *)((long)puVar37 + (ulong)((char)*puVar25 == (char)*puVar37));
          }
          uVar44 = (long)puVar37 - (long)puVar29;
        }
        lVar41 = uVar44 + 4;
        uVar21 = iVar26 - (int)piVar22;
        if (src < puVar43) {
          puVar29 = (ulong *)(pBVar10 + (uVar40 - 1));
          do {
            puVar25 = (ulong *)((long)puVar43 + -1);
            if ((*(char *)puVar25 != (char)*puVar29) ||
               (lVar41 = lVar41 + 1, puVar43 = puVar25, puVar25 <= src)) break;
            bVar14 = puVar28 < puVar29;
            puVar29 = (ulong *)((long)puVar29 + -1);
          } while (bVar14);
        }
      }
      goto LAB_018f8c88;
    }
  }
  else if (uVar9 == 6) {
    if (puVar29 <= puVar16) {
      bVar19 = 0x40 - (char)(ms->cParams).hashLog;
      bVar20 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar5 - 7);
      puVar2 = (ulong *)((long)puVar5 - 3);
      puVar3 = (ulong *)((long)puVar5 - 1);
      puVar4 = puVar5 + -4;
LAB_018f77e1:
      uVar38 = (uint)uVar44;
      uVar33 = *puVar43 * -0x30e44323485a9b9d >> (bVar19 & 0x3f);
      puVar25 = puVar43 + 0x20;
      uVar35 = (ulong)pUVar11[uVar33];
      puVar37 = (ulong *)(pBVar10 + uVar35);
      uVar21 = (uint)uVar45;
      lVar41 = -uVar45;
      uVar46 = 1;
      uVar39 = *puVar43;
      while( true ) {
        puVar17 = puVar29;
        uVar24 = uVar39 * -0x30e4432340650000 >> (bVar20 & 0x3f);
        uVar9 = pUVar12[uVar24];
        uVar40 = (ulong)uVar9;
        iVar26 = (int)puVar43;
        UVar32 = iVar26 - iVar42;
        pUVar12[uVar24] = UVar32;
        pUVar11[uVar33] = UVar32;
        if ((uVar21 != 0) && (*(int *)((long)puVar43 + lVar41 + 1) == *(int *)((long)puVar43 + 1)))
        {
          puVar29 = (ulong *)((long)puVar43 + 5);
          puVar37 = (ulong *)((long)puVar43 + lVar41 + 5);
          puVar25 = puVar29;
          if (puVar1 <= puVar29) goto LAB_018f7b58;
          if (*puVar37 != *puVar29) {
            uVar39 = *puVar29 ^ *puVar37;
            uVar45 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
              }
            }
            uVar39 = uVar45 >> 3 & 0x1fffffff;
            goto LAB_018f7b9f;
          }
          lVar34 = 0;
          goto LAB_018f794d;
        }
        uVar24 = *puVar17;
        uVar33 = uVar24 * -0x30e44323485a9b9d >> (bVar19 & 0x3f);
        if ((uVar23 < (uint)uVar35) && (*puVar37 == uVar39)) {
          puVar29 = puVar43 + 1;
          puVar25 = puVar37 + 1;
          puVar30 = puVar29;
          if (puVar1 <= puVar29) goto LAB_018f7f4a;
          if (*puVar25 != *puVar29) {
            uVar39 = *puVar29 ^ *puVar25;
            uVar44 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
              }
            }
            uVar44 = uVar44 >> 3 & 0x1fffffff;
            goto LAB_018f7f96;
          }
          lVar41 = 0;
          goto LAB_018f79c5;
        }
        uVar35 = (ulong)pUVar11[uVar33];
        puVar37 = (ulong *)(pBVar10 + uVar35);
        if ((uVar23 < uVar9) && (piVar22 = (int *)(pBVar10 + uVar40), *piVar22 == (int)*puVar43))
        break;
        if (puVar25 <= puVar17) {
          uVar46 = uVar46 + 1;
          puVar25 = puVar25 + 0x20;
        }
        puVar29 = (ulong *)((long)puVar17 + uVar46);
        uVar39 = uVar24;
        puVar43 = puVar17;
        if (puVar16 < (ulong *)((long)puVar17 + uVar46)) goto LAB_018f8d8d;
      }
      if ((uVar23 < pUVar11[uVar33]) && (*puVar37 == uVar24)) {
        puVar43 = puVar17 + 1;
        puVar29 = puVar37 + 1;
        puVar25 = puVar43;
        if (puVar43 < puVar1) {
          if (*puVar29 == *puVar43) {
            lVar41 = 0;
            do {
              puVar29 = (ulong *)((long)puVar17 + lVar41 + 0x10);
              if (puVar1 <= puVar29) {
                puVar29 = (ulong *)(pBVar10 + lVar41 + uVar35 + 0x10);
                puVar25 = (ulong *)((long)puVar17 + lVar41 + 0x10);
                goto LAB_018f80d2;
              }
              lVar34 = lVar41 + uVar35 + 0x10;
              uVar44 = *puVar29;
              lVar41 = lVar41 + 8;
            } while (*(ulong *)(pBVar10 + lVar34) == uVar44);
            uVar44 = uVar44 ^ *(ulong *)(pBVar10 + lVar34);
            uVar39 = 0;
            if (uVar44 != 0) {
              for (; (uVar44 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
              }
            }
            uVar44 = (uVar39 >> 3 & 0x1fffffff) + lVar41;
          }
          else {
            uVar39 = *puVar43 ^ *puVar29;
            uVar44 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
              }
            }
            uVar44 = uVar44 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_018f80d2:
          if ((puVar25 < puVar2) && ((int)*puVar29 == (int)*puVar25)) {
            puVar25 = (ulong *)((long)puVar25 + 4);
            puVar29 = (ulong *)((long)puVar29 + 4);
          }
          if ((puVar25 < puVar3) && ((short)*puVar29 == (short)*puVar25)) {
            puVar25 = (ulong *)((long)puVar25 + 2);
            puVar29 = (ulong *)((long)puVar29 + 2);
          }
          if (puVar25 < puVar5) {
            puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar29 == (char)*puVar25));
          }
          uVar44 = (long)puVar25 - (long)puVar43;
        }
        lVar41 = uVar44 + 8;
        uVar21 = (int)puVar17 - (int)puVar37;
        puVar43 = puVar17;
        if (src < puVar17) {
          puVar29 = (ulong *)(pBVar10 + (uVar35 - 1));
          do {
            puVar25 = (ulong *)((long)puVar43 + -1);
            if ((*(char *)puVar25 != (char)*puVar29) ||
               (lVar41 = lVar41 + 1, puVar43 = puVar25, puVar25 <= src)) break;
            bVar14 = puVar28 < puVar29;
            puVar29 = (ulong *)((long)puVar29 + -1);
          } while (bVar14);
        }
      }
      else {
        puVar29 = (ulong *)((long)puVar43 + 4);
        puVar25 = (ulong *)(piVar22 + 1);
        puVar37 = puVar29;
        if (puVar29 < puVar1) {
          if (*puVar25 == *puVar29) {
            lVar41 = 0;
            do {
              puVar25 = (ulong *)((long)puVar43 + lVar41 + 0xc);
              if (puVar1 <= puVar25) {
                puVar25 = (ulong *)(pBVar10 + lVar41 + uVar40 + 0xc);
                puVar37 = (ulong *)((long)puVar43 + lVar41 + 0xc);
                goto LAB_018f800b;
              }
              lVar34 = lVar41 + uVar40 + 0xc;
              uVar44 = *puVar25;
              lVar41 = lVar41 + 8;
            } while (*(ulong *)(pBVar10 + lVar34) == uVar44);
            uVar44 = uVar44 ^ *(ulong *)(pBVar10 + lVar34);
            uVar39 = 0;
            if (uVar44 != 0) {
              for (; (uVar44 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
              }
            }
            uVar44 = (uVar39 >> 3 & 0x1fffffff) + lVar41;
          }
          else {
            uVar39 = *puVar29 ^ *puVar25;
            uVar44 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
              }
            }
            uVar44 = uVar44 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_018f800b:
          if ((puVar37 < puVar2) && ((int)*puVar25 == (int)*puVar37)) {
            puVar37 = (ulong *)((long)puVar37 + 4);
            puVar25 = (ulong *)((long)puVar25 + 4);
          }
          if ((puVar37 < puVar3) && ((short)*puVar25 == (short)*puVar37)) {
            puVar37 = (ulong *)((long)puVar37 + 2);
            puVar25 = (ulong *)((long)puVar25 + 2);
          }
          if (puVar37 < puVar5) {
            puVar37 = (ulong *)((long)puVar37 + (ulong)((char)*puVar25 == (char)*puVar37));
          }
          uVar44 = (long)puVar37 - (long)puVar29;
        }
        lVar41 = uVar44 + 4;
        uVar21 = iVar26 - (int)piVar22;
        if (src < puVar43) {
          puVar29 = (ulong *)(pBVar10 + (uVar40 - 1));
          do {
            puVar25 = (ulong *)((long)puVar43 + -1);
            if ((*(char *)puVar25 != (char)*puVar29) ||
               (lVar41 = lVar41 + 1, puVar43 = puVar25, puVar25 <= src)) break;
            bVar14 = puVar28 < puVar29;
            puVar29 = (ulong *)((long)puVar29 + -1);
          } while (bVar14);
        }
      }
      goto LAB_018f817d;
    }
  }
  else if (uVar9 == 7) {
    if (puVar29 <= puVar16) {
      bVar19 = 0x40 - (char)(ms->cParams).hashLog;
      bVar20 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar5 - 7);
      puVar2 = (ulong *)((long)puVar5 - 3);
      puVar3 = (ulong *)((long)puVar5 - 1);
      puVar4 = puVar5 + -4;
LAB_018f6cd6:
      uVar38 = (uint)uVar44;
      uVar33 = *puVar43 * -0x30e44323485a9b9d >> (bVar19 & 0x3f);
      puVar25 = puVar43 + 0x20;
      uVar35 = (ulong)pUVar11[uVar33];
      puVar37 = (ulong *)(pBVar10 + uVar35);
      uVar21 = (uint)uVar45;
      lVar41 = -uVar45;
      uVar46 = 1;
      uVar39 = *puVar43;
      while( true ) {
        puVar17 = puVar29;
        uVar24 = uVar39 * -0x30e44323405a9d00 >> (bVar20 & 0x3f);
        uVar9 = pUVar12[uVar24];
        uVar40 = (ulong)uVar9;
        iVar26 = (int)puVar43;
        UVar32 = iVar26 - iVar42;
        pUVar12[uVar24] = UVar32;
        pUVar11[uVar33] = UVar32;
        if ((uVar21 != 0) && (*(int *)((long)puVar43 + lVar41 + 1) == *(int *)((long)puVar43 + 1)))
        {
          puVar29 = (ulong *)((long)puVar43 + 5);
          puVar37 = (ulong *)((long)puVar43 + lVar41 + 5);
          puVar25 = puVar29;
          if (puVar1 <= puVar29) goto LAB_018f704d;
          if (*puVar37 != *puVar29) {
            uVar39 = *puVar29 ^ *puVar37;
            uVar45 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
              }
            }
            uVar39 = uVar45 >> 3 & 0x1fffffff;
            goto LAB_018f7094;
          }
          lVar34 = 0;
          goto LAB_018f6e42;
        }
        uVar24 = *puVar17;
        uVar33 = uVar24 * -0x30e44323485a9b9d >> (bVar19 & 0x3f);
        if ((uVar23 < (uint)uVar35) && (*puVar37 == uVar39)) {
          puVar29 = puVar43 + 1;
          puVar25 = puVar37 + 1;
          puVar30 = puVar29;
          if (puVar1 <= puVar29) goto LAB_018f743f;
          if (*puVar25 != *puVar29) {
            uVar39 = *puVar29 ^ *puVar25;
            uVar44 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
              }
            }
            uVar44 = uVar44 >> 3 & 0x1fffffff;
            goto LAB_018f748b;
          }
          lVar41 = 0;
          goto LAB_018f6eba;
        }
        uVar35 = (ulong)pUVar11[uVar33];
        puVar37 = (ulong *)(pBVar10 + uVar35);
        if ((uVar23 < uVar9) && (piVar22 = (int *)(pBVar10 + uVar40), *piVar22 == (int)*puVar43))
        break;
        if (puVar25 <= puVar17) {
          uVar46 = uVar46 + 1;
          puVar25 = puVar25 + 0x20;
        }
        puVar29 = (ulong *)((long)puVar17 + uVar46);
        uVar39 = uVar24;
        puVar43 = puVar17;
        if (puVar16 < (ulong *)((long)puVar17 + uVar46)) goto LAB_018f8d8d;
      }
      if ((uVar23 < pUVar11[uVar33]) && (*puVar37 == uVar24)) {
        puVar43 = puVar17 + 1;
        puVar29 = puVar37 + 1;
        puVar25 = puVar43;
        if (puVar43 < puVar1) {
          if (*puVar29 == *puVar43) {
            lVar41 = 0;
            do {
              puVar29 = (ulong *)((long)puVar17 + lVar41 + 0x10);
              if (puVar1 <= puVar29) {
                puVar29 = (ulong *)(pBVar10 + lVar41 + uVar35 + 0x10);
                puVar25 = (ulong *)((long)puVar17 + lVar41 + 0x10);
                goto LAB_018f75c7;
              }
              lVar34 = lVar41 + uVar35 + 0x10;
              uVar44 = *puVar29;
              lVar41 = lVar41 + 8;
            } while (*(ulong *)(pBVar10 + lVar34) == uVar44);
            uVar44 = uVar44 ^ *(ulong *)(pBVar10 + lVar34);
            uVar39 = 0;
            if (uVar44 != 0) {
              for (; (uVar44 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
              }
            }
            uVar44 = (uVar39 >> 3 & 0x1fffffff) + lVar41;
          }
          else {
            uVar39 = *puVar43 ^ *puVar29;
            uVar44 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
              }
            }
            uVar44 = uVar44 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_018f75c7:
          if ((puVar25 < puVar2) && ((int)*puVar29 == (int)*puVar25)) {
            puVar25 = (ulong *)((long)puVar25 + 4);
            puVar29 = (ulong *)((long)puVar29 + 4);
          }
          if ((puVar25 < puVar3) && ((short)*puVar29 == (short)*puVar25)) {
            puVar25 = (ulong *)((long)puVar25 + 2);
            puVar29 = (ulong *)((long)puVar29 + 2);
          }
          if (puVar25 < puVar5) {
            puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar29 == (char)*puVar25));
          }
          uVar44 = (long)puVar25 - (long)puVar43;
        }
        lVar41 = uVar44 + 8;
        uVar21 = (int)puVar17 - (int)puVar37;
        puVar43 = puVar17;
        if (src < puVar17) {
          puVar29 = (ulong *)(pBVar10 + (uVar35 - 1));
          do {
            puVar25 = (ulong *)((long)puVar43 + -1);
            if ((*(char *)puVar25 != (char)*puVar29) ||
               (lVar41 = lVar41 + 1, puVar43 = puVar25, puVar25 <= src)) break;
            bVar14 = puVar28 < puVar29;
            puVar29 = (ulong *)((long)puVar29 + -1);
          } while (bVar14);
        }
      }
      else {
        puVar29 = (ulong *)((long)puVar43 + 4);
        puVar25 = (ulong *)(piVar22 + 1);
        puVar37 = puVar29;
        if (puVar29 < puVar1) {
          if (*puVar25 == *puVar29) {
            lVar41 = 0;
            do {
              puVar25 = (ulong *)((long)puVar43 + lVar41 + 0xc);
              if (puVar1 <= puVar25) {
                puVar25 = (ulong *)(pBVar10 + lVar41 + uVar40 + 0xc);
                puVar37 = (ulong *)((long)puVar43 + lVar41 + 0xc);
                goto LAB_018f7500;
              }
              lVar34 = lVar41 + uVar40 + 0xc;
              uVar44 = *puVar25;
              lVar41 = lVar41 + 8;
            } while (*(ulong *)(pBVar10 + lVar34) == uVar44);
            uVar44 = uVar44 ^ *(ulong *)(pBVar10 + lVar34);
            uVar39 = 0;
            if (uVar44 != 0) {
              for (; (uVar44 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
              }
            }
            uVar44 = (uVar39 >> 3 & 0x1fffffff) + lVar41;
          }
          else {
            uVar39 = *puVar29 ^ *puVar25;
            uVar44 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
              }
            }
            uVar44 = uVar44 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_018f7500:
          if ((puVar37 < puVar2) && ((int)*puVar25 == (int)*puVar37)) {
            puVar37 = (ulong *)((long)puVar37 + 4);
            puVar25 = (ulong *)((long)puVar25 + 4);
          }
          if ((puVar37 < puVar3) && ((short)*puVar25 == (short)*puVar37)) {
            puVar37 = (ulong *)((long)puVar37 + 2);
            puVar25 = (ulong *)((long)puVar25 + 2);
          }
          if (puVar37 < puVar5) {
            puVar37 = (ulong *)((long)puVar37 + (ulong)((char)*puVar25 == (char)*puVar37));
          }
          uVar44 = (long)puVar37 - (long)puVar29;
        }
        lVar41 = uVar44 + 4;
        uVar21 = iVar26 - (int)piVar22;
        if (src < puVar43) {
          puVar29 = (ulong *)(pBVar10 + (uVar40 - 1));
          do {
            puVar25 = (ulong *)((long)puVar43 + -1);
            if ((*(char *)puVar25 != (char)*puVar29) ||
               (lVar41 = lVar41 + 1, puVar43 = puVar25, puVar25 <= src)) break;
            bVar14 = puVar28 < puVar29;
            puVar29 = (ulong *)((long)puVar29 + -1);
          } while (bVar14);
        }
      }
      goto LAB_018f7672;
    }
  }
  else if (puVar29 <= puVar16) {
    bVar19 = 0x40 - (char)(ms->cParams).hashLog;
    bVar20 = 0x20 - (char)(ms->cParams).chainLog;
    puVar1 = (ulong *)((long)puVar5 - 7);
    puVar2 = (ulong *)((long)puVar5 - 3);
    puVar3 = (ulong *)((long)puVar5 - 1);
    puVar4 = puVar5 + -4;
LAB_018f8e5b:
    uVar38 = (uint)uVar44;
    uVar39 = *puVar43;
    uVar33 = uVar39 * -0x30e44323485a9b9d >> (bVar19 & 0x3f);
    puVar25 = puVar43 + 0x20;
    uVar46 = (ulong)pUVar11[uVar33];
    puVar37 = (ulong *)(pBVar10 + uVar46);
    uVar21 = (uint)uVar45;
    lVar41 = -uVar45;
    uVar35 = 1;
    while( true ) {
      puVar17 = puVar29;
      uVar27 = (uint)((int)uVar39 * -0x61c8864f) >> (bVar20 & 0x1f);
      uVar9 = pUVar12[uVar27];
      uVar24 = (ulong)uVar9;
      UVar32 = (int)puVar43 - iVar42;
      pUVar12[uVar27] = UVar32;
      pUVar11[uVar33] = UVar32;
      if ((uVar21 != 0) && (*(int *)((long)puVar43 + lVar41 + 1) == *(int *)((long)puVar43 + 1))) {
        puVar29 = (ulong *)((long)puVar43 + 5);
        puVar37 = (ulong *)((long)puVar43 + lVar41 + 5);
        puVar25 = puVar29;
        if (puVar1 <= puVar29) goto LAB_018f918b;
        if (*puVar37 != *puVar29) {
          uVar33 = *puVar29 ^ *puVar37;
          uVar39 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
            }
          }
          uVar39 = uVar39 >> 3 & 0x1fffffff;
          goto LAB_018f91d5;
        }
        lVar34 = 0;
        goto LAB_018f8fb5;
      }
      uVar39 = *puVar17;
      uVar33 = uVar39 * -0x30e44323485a9b9d >> (bVar19 & 0x3f);
      if ((uVar23 < (uint)uVar46) && (*puVar37 == *puVar43)) {
        puVar29 = puVar43 + 1;
        puVar25 = puVar37 + 1;
        puVar30 = puVar29;
        if (puVar1 <= puVar29) goto LAB_018f9570;
        if (*puVar25 != *puVar29) {
          uVar39 = *puVar29 ^ *puVar25;
          uVar44 = 0;
          if (uVar39 != 0) {
            for (; (uVar39 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
            }
          }
          uVar44 = uVar44 >> 3 & 0x1fffffff;
          goto LAB_018f95c4;
        }
        lVar41 = 0;
        goto LAB_018f9026;
      }
      uVar46 = (ulong)pUVar11[uVar33];
      puVar37 = (ulong *)(pBVar10 + uVar46);
      if ((uVar23 < uVar9) && (piVar22 = (int *)(pBVar10 + uVar24), *piVar22 == (int)*puVar43))
      break;
      if (puVar25 <= puVar17) {
        uVar35 = uVar35 + 1;
        puVar25 = puVar25 + 0x20;
      }
      puVar29 = (ulong *)((long)puVar17 + uVar35);
      puVar43 = puVar17;
      if (puVar16 < (ulong *)((long)puVar17 + uVar35)) goto LAB_018f8d8d;
    }
    if ((uVar23 < pUVar11[uVar33]) && (*puVar37 == uVar39)) {
      puVar43 = puVar17 + 1;
      puVar29 = puVar37 + 1;
      puVar25 = puVar43;
      if (puVar43 < puVar1) {
        if (*puVar29 == *puVar43) {
          lVar41 = 0;
          do {
            puVar29 = (ulong *)((long)puVar17 + lVar41 + 0x10);
            if (puVar1 <= puVar29) {
              puVar29 = (ulong *)(pBVar10 + lVar41 + uVar46 + 0x10);
              puVar25 = (ulong *)((long)puVar17 + lVar41 + 0x10);
              goto LAB_018f9714;
            }
            lVar34 = lVar41 + uVar46 + 0x10;
            uVar44 = *puVar29;
            lVar41 = lVar41 + 8;
          } while (*(ulong *)(pBVar10 + lVar34) == uVar44);
          uVar44 = uVar44 ^ *(ulong *)(pBVar10 + lVar34);
          uVar39 = 0;
          if (uVar44 != 0) {
            for (; (uVar44 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
            }
          }
          uVar44 = (uVar39 >> 3 & 0x1fffffff) + lVar41;
        }
        else {
          uVar39 = *puVar43 ^ *puVar29;
          uVar44 = 0;
          if (uVar39 != 0) {
            for (; (uVar39 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
            }
          }
          uVar44 = uVar44 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_018f9714:
        if ((puVar25 < puVar2) && ((int)*puVar29 == (int)*puVar25)) {
          puVar25 = (ulong *)((long)puVar25 + 4);
          puVar29 = (ulong *)((long)puVar29 + 4);
        }
        if ((puVar25 < puVar3) && ((short)*puVar29 == (short)*puVar25)) {
          puVar25 = (ulong *)((long)puVar25 + 2);
          puVar29 = (ulong *)((long)puVar29 + 2);
        }
        if (puVar25 < puVar5) {
          puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar29 == (char)*puVar25));
        }
        uVar44 = (long)puVar25 - (long)puVar43;
      }
      lVar41 = uVar44 + 8;
      uVar40 = (long)puVar17 - (long)puVar37;
      puVar43 = puVar17;
      if (src < puVar17) {
        puVar29 = (ulong *)(pBVar10 + (uVar46 - 1));
        do {
          puVar25 = (ulong *)((long)puVar43 + -1);
          if ((*(char *)puVar25 != (char)*puVar29) ||
             (lVar41 = lVar41 + 1, puVar43 = puVar25, puVar25 <= src)) break;
          bVar14 = puVar28 < puVar29;
          puVar29 = (ulong *)((long)puVar29 + -1);
        } while (bVar14);
      }
    }
    else {
      puVar29 = (ulong *)((long)puVar43 + 4);
      puVar25 = (ulong *)(piVar22 + 1);
      puVar37 = puVar29;
      if (puVar29 < puVar1) {
        if (*puVar25 == *puVar29) {
          lVar41 = 0;
          do {
            puVar25 = (ulong *)((long)puVar43 + lVar41 + 0xc);
            if (puVar1 <= puVar25) {
              puVar25 = (ulong *)(pBVar10 + lVar41 + uVar24 + 0xc);
              puVar37 = (ulong *)((long)puVar43 + lVar41 + 0xc);
              goto LAB_018f9639;
            }
            lVar34 = lVar41 + uVar24 + 0xc;
            uVar44 = *puVar25;
            lVar41 = lVar41 + 8;
          } while (*(ulong *)(pBVar10 + lVar34) == uVar44);
          uVar44 = uVar44 ^ *(ulong *)(pBVar10 + lVar34);
          uVar39 = 0;
          if (uVar44 != 0) {
            for (; (uVar44 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
            }
          }
          uVar44 = (uVar39 >> 3 & 0x1fffffff) + lVar41;
        }
        else {
          uVar39 = *puVar29 ^ *puVar25;
          uVar44 = 0;
          if (uVar39 != 0) {
            for (; (uVar39 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
            }
          }
          uVar44 = uVar44 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_018f9639:
        if ((puVar37 < puVar2) && ((int)*puVar25 == (int)*puVar37)) {
          puVar37 = (ulong *)((long)puVar37 + 4);
          puVar25 = (ulong *)((long)puVar25 + 4);
        }
        if ((puVar37 < puVar3) && ((short)*puVar25 == (short)*puVar37)) {
          puVar37 = (ulong *)((long)puVar37 + 2);
          puVar25 = (ulong *)((long)puVar25 + 2);
        }
        if (puVar37 < puVar5) {
          puVar37 = (ulong *)((long)puVar37 + (ulong)((char)*puVar25 == (char)*puVar37));
        }
        uVar44 = (long)puVar37 - (long)puVar29;
      }
      lVar41 = uVar44 + 4;
      uVar40 = (long)puVar43 - (long)piVar22;
      if (src < puVar43) {
        puVar29 = (ulong *)(pBVar10 + (uVar24 - 1));
        do {
          puVar25 = (ulong *)((long)puVar43 + -1);
          if ((*(char *)puVar25 != (char)*puVar29) ||
             (lVar41 = lVar41 + 1, puVar43 = puVar25, puVar25 <= src)) break;
          bVar14 = puVar28 < puVar29;
          puVar29 = (ulong *)((long)puVar29 + -1);
        } while (bVar14);
      }
    }
    goto LAB_018f97c3;
  }
LAB_018f8d8d:
  if (uVar36 <= uVar31) {
    uVar36 = 0;
  }
  uVar23 = uVar36;
  if (uVar21 != 0) {
    uVar23 = uVar8;
  }
  if (uVar8 <= uVar31) {
    uVar23 = uVar36;
    uVar8 = 0;
  }
  if (uVar21 != 0) {
    uVar8 = uVar21;
  }
  if (uVar38 != 0) {
    uVar23 = uVar38;
  }
  *rep = uVar8;
  rep[1] = uVar23;
  return (long)puVar5 - (long)src;
LAB_018f8458:
  puVar25 = (ulong *)((long)puVar43 + lVar34 + 0xd);
  if (puVar25 < puVar1) goto code_r0x018f8467;
  puVar37 = (ulong *)((long)puVar43 + lVar41 + lVar34 + 0xd);
  puVar25 = (ulong *)((long)puVar43 + lVar34 + 0xd);
LAB_018f8663:
  if ((puVar25 < puVar2) && ((int)*puVar37 == (int)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 4);
    puVar37 = (ulong *)((long)puVar37 + 4);
  }
  if ((puVar25 < puVar3) && ((short)*puVar37 == (short)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 2);
    puVar37 = (ulong *)((long)puVar37 + 2);
  }
  if (puVar25 < puVar5) {
    puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar37 == (char)*puVar25));
  }
  uVar39 = (long)puVar25 - (long)puVar29;
  goto LAB_018f86aa;
code_r0x018f8467:
  uVar45 = *(ulong *)((long)puVar43 + lVar34 + lVar41 + 0xd);
  uVar39 = *puVar25;
  lVar34 = lVar34 + 8;
  if (uVar45 != uVar39) goto code_r0x018f8477;
  goto LAB_018f8458;
code_r0x018f8477:
  uVar39 = uVar39 ^ uVar45;
  uVar45 = 0;
  if (uVar39 != 0) {
    for (; (uVar39 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
    }
  }
  uVar39 = (uVar45 >> 3 & 0x1fffffff) + lVar34;
LAB_018f86aa:
  puVar43 = (ulong *)((long)puVar43 + 1);
  uVar45 = (long)puVar43 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (puVar4 < puVar43) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar43,(BYTE *)puVar4);
LAB_018f86dd:
    seqStore->lit = seqStore->lit + uVar45;
    psVar18 = seqStore->sequences;
    if (0xffff < uVar45) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar33 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar33;
    pBVar13 = seqStore->lit;
    if (0x10 < uVar45) {
      uVar33 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar13 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar13 + 0x18) = uVar33;
      if (0x20 < (long)uVar45) {
        lVar41 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar41 + 0x20);
          uVar15 = puVar7[1];
          pBVar6 = pBVar13 + lVar41 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar15;
          puVar7 = (undefined8 *)((long)src + lVar41 + 0x30);
          uVar15 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar15;
          lVar41 = lVar41 + 0x20;
        } while (pBVar6 + 0x20 < pBVar13 + uVar45);
      }
      goto LAB_018f86dd;
    }
    seqStore->lit = pBVar13 + uVar45;
    psVar18 = seqStore->sequences;
  }
  lVar41 = uVar39 + 4;
  psVar18->litLength = (U16)uVar45;
  psVar18->offBase = 1;
  uVar39 = uVar39 + 1;
  uVar45 = uVar44;
  goto joined_r0x018f8789;
LAB_018f84d0:
  puVar25 = (ulong *)((long)puVar43 + lVar41 + 0x10);
  if (puVar25 < puVar1) goto code_r0x018f84df;
  puVar25 = (ulong *)((long)puVar37 + lVar41 + 0x10);
  puVar30 = (ulong *)((long)puVar43 + lVar41 + 0x10);
LAB_018f8a55:
  if ((puVar30 < puVar2) && ((int)*puVar25 == (int)*puVar30)) {
    puVar30 = (ulong *)((long)puVar30 + 4);
    puVar25 = (ulong *)((long)puVar25 + 4);
  }
  if ((puVar30 < puVar3) && ((short)*puVar25 == (short)*puVar30)) {
    puVar30 = (ulong *)((long)puVar30 + 2);
    puVar25 = (ulong *)((long)puVar25 + 2);
  }
  if (puVar30 < puVar5) {
    puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar25 == (char)*puVar30));
  }
  uVar44 = (long)puVar30 - (long)puVar29;
  goto LAB_018f8aa1;
code_r0x018f84df:
  uVar44 = *(ulong *)((long)puVar37 + lVar41 + 0x10);
  uVar39 = *puVar25;
  lVar41 = lVar41 + 8;
  if (uVar44 != uVar39) goto code_r0x018f84f0;
  goto LAB_018f84d0;
code_r0x018f84f0:
  uVar39 = uVar39 ^ uVar44;
  uVar44 = 0;
  if (uVar39 != 0) {
    for (; (uVar39 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
    }
  }
  uVar44 = (uVar44 >> 3 & 0x1fffffff) + lVar41;
LAB_018f8aa1:
  lVar41 = uVar44 + 8;
  uVar21 = iVar26 - (int)puVar37;
  if ((puVar28 < puVar37) && (src < puVar43)) {
    while( true ) {
      puVar37 = (ulong *)((long)puVar37 + -1);
      puVar29 = (ulong *)((long)puVar43 + -1);
      if (*(char *)puVar29 != *(char *)puVar37) break;
      lVar41 = lVar41 + 1;
      puVar43 = puVar29;
      if ((puVar29 <= src) || (puVar37 <= puVar28)) break;
    }
  }
LAB_018f8c88:
  if (uVar46 < 4) {
    pUVar11[uVar33] = (int)puVar17 - iVar42;
  }
  uVar44 = (long)puVar43 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (puVar4 < puVar43) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar43,(BYTE *)puVar4);
LAB_018f8ccc:
    seqStore->lit = seqStore->lit + uVar44;
    psVar18 = seqStore->sequences;
    if (0xffff < uVar44) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar39 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar39;
    pBVar13 = seqStore->lit;
    if (0x10 < uVar44) {
      uVar39 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar13 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar13 + 0x18) = uVar39;
      if (0x20 < (long)uVar44) {
        lVar34 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar34 + 0x20);
          uVar15 = puVar7[1];
          pBVar6 = pBVar13 + lVar34 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar15;
          puVar7 = (undefined8 *)((long)src + lVar34 + 0x30);
          uVar15 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar15;
          lVar34 = lVar34 + 0x20;
        } while (pBVar6 + 0x20 < pBVar13 + uVar44);
      }
      goto LAB_018f8ccc;
    }
    seqStore->lit = pBVar13 + uVar44;
    psVar18 = seqStore->sequences;
  }
  psVar18->litLength = (U16)uVar44;
  psVar18->offBase = uVar21 + 3;
  uVar39 = lVar41 - 3;
joined_r0x018f8789:
  if (0xffff < uVar39) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
  }
  src = (void *)((long)puVar43 + lVar41);
  psVar18->mlBase = (U16)uVar39;
  seqStore->sequences = psVar18 + 1;
  if (puVar16 < src) {
    uVar44 = uVar45;
    uVar45 = (ulong)uVar21;
  }
  else {
    uVar38 = UVar32 + 2;
    lVar41 = *(long *)(pBVar10 + uVar38);
    pUVar11[(ulong)(lVar41 * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] = uVar38;
    pUVar11[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] =
         ((int)src + -2) - iVar42;
    pUVar12[(ulong)(lVar41 * -0x30e4432345000000) >> (bVar20 & 0x3f)] = uVar38;
    pUVar12[(ulong)(*(long *)((long)src + -1) * -0x30e4432345000000) >> (bVar20 & 0x3f)] =
         ((int)src + -1) - iVar42;
    uVar39 = uVar45;
    do {
      uVar33 = (ulong)uVar21;
      uVar21 = (uint)uVar39;
      uVar44 = uVar39;
      uVar45 = uVar33;
      if ((uVar21 == 0) || ((int)*src != *(int *)((long)src - uVar39))) break;
      lVar41 = -uVar39;
      puVar43 = (ulong *)((long)src + 4);
      puVar25 = (ulong *)((long)src + lVar41 + 4);
      puVar29 = puVar43;
      if (puVar43 < puVar1) {
        if (*puVar25 == *puVar43) {
          lVar34 = 0;
          do {
            puVar29 = (ulong *)((long)src + lVar34 + 0xc);
            if (puVar1 <= puVar29) {
              puVar25 = (ulong *)((long)src + lVar41 + lVar34 + 0xc);
              puVar29 = (ulong *)((long)src + lVar34 + 0xc);
              goto LAB_018f88ed;
            }
            uVar44 = *(ulong *)((long)src + lVar34 + lVar41 + 0xc);
            uVar45 = *puVar29;
            lVar34 = lVar34 + 8;
          } while (uVar44 == uVar45);
          uVar45 = uVar45 ^ uVar44;
          uVar44 = 0;
          if (uVar45 != 0) {
            for (; (uVar45 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
            }
          }
          uVar44 = (uVar44 >> 3 & 0x1fffffff) + lVar34;
        }
        else {
          uVar45 = *puVar43 ^ *puVar25;
          uVar44 = 0;
          if (uVar45 != 0) {
            for (; (uVar45 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
            }
          }
          uVar44 = uVar44 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_018f88ed:
        if ((puVar29 < puVar2) && ((int)*puVar25 == (int)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 4);
          puVar25 = (ulong *)((long)puVar25 + 4);
        }
        if ((puVar29 < puVar3) && ((short)*puVar25 == (short)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 2);
          puVar25 = (ulong *)((long)puVar25 + 2);
        }
        if (puVar29 < puVar5) {
          puVar29 = (ulong *)((long)puVar29 + (ulong)((char)*puVar25 == (char)*puVar29));
        }
        uVar44 = (long)puVar29 - (long)puVar43;
      }
      UVar32 = (int)src - iVar42;
      uVar45 = *src;
      pUVar12[uVar45 * -0x30e4432345000000 >> (bVar20 & 0x3f)] = UVar32;
      pUVar11[uVar45 * -0x30e44323485a9b9d >> (bVar19 & 0x3f)] = UVar32;
      puVar43 = (ulong *)seqStore->lit;
      if (puVar4 < src) {
        ZSTD_safecopyLiterals((BYTE *)puVar43,(BYTE *)src,(BYTE *)src,(BYTE *)puVar4);
      }
      else {
        uVar45 = *(ulong *)((long)src + 8);
        *puVar43 = *src;
        puVar43[1] = uVar45;
      }
      psVar18 = seqStore->sequences;
      psVar18->litLength = 0;
      psVar18->offBase = 1;
      if (0xffff < uVar44 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar18->mlBase = (U16)(uVar44 + 1);
      seqStore->sequences = psVar18 + 1;
      src = (void *)((long)src + uVar44 + 4);
      uVar44 = uVar33;
      uVar45 = uVar39;
      uVar39 = uVar33;
    } while (src <= puVar16);
  }
  puVar29 = (ulong *)((long)src + 1);
  uVar21 = (uint)uVar45;
  uVar38 = (uint)uVar44;
  puVar43 = (ulong *)src;
  if (puVar16 < puVar29) goto LAB_018f8d8d;
  goto LAB_018f82ec;
LAB_018f794d:
  puVar25 = (ulong *)((long)puVar43 + lVar34 + 0xd);
  if (puVar25 < puVar1) goto code_r0x018f795c;
  puVar37 = (ulong *)((long)puVar43 + lVar41 + lVar34 + 0xd);
  puVar25 = (ulong *)((long)puVar43 + lVar34 + 0xd);
LAB_018f7b58:
  if ((puVar25 < puVar2) && ((int)*puVar37 == (int)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 4);
    puVar37 = (ulong *)((long)puVar37 + 4);
  }
  if ((puVar25 < puVar3) && ((short)*puVar37 == (short)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 2);
    puVar37 = (ulong *)((long)puVar37 + 2);
  }
  if (puVar25 < puVar5) {
    puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar37 == (char)*puVar25));
  }
  uVar39 = (long)puVar25 - (long)puVar29;
  goto LAB_018f7b9f;
code_r0x018f795c:
  uVar45 = *(ulong *)((long)puVar43 + lVar34 + lVar41 + 0xd);
  uVar39 = *puVar25;
  lVar34 = lVar34 + 8;
  if (uVar45 != uVar39) goto code_r0x018f796c;
  goto LAB_018f794d;
code_r0x018f796c:
  uVar39 = uVar39 ^ uVar45;
  uVar45 = 0;
  if (uVar39 != 0) {
    for (; (uVar39 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
    }
  }
  uVar39 = (uVar45 >> 3 & 0x1fffffff) + lVar34;
LAB_018f7b9f:
  puVar43 = (ulong *)((long)puVar43 + 1);
  uVar45 = (long)puVar43 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (puVar4 < puVar43) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar43,(BYTE *)puVar4);
LAB_018f7bd2:
    seqStore->lit = seqStore->lit + uVar45;
    psVar18 = seqStore->sequences;
    if (0xffff < uVar45) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar33 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar33;
    pBVar13 = seqStore->lit;
    if (0x10 < uVar45) {
      uVar33 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar13 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar13 + 0x18) = uVar33;
      if (0x20 < (long)uVar45) {
        lVar41 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar41 + 0x20);
          uVar15 = puVar7[1];
          pBVar6 = pBVar13 + lVar41 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar15;
          puVar7 = (undefined8 *)((long)src + lVar41 + 0x30);
          uVar15 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar15;
          lVar41 = lVar41 + 0x20;
        } while (pBVar6 + 0x20 < pBVar13 + uVar45);
      }
      goto LAB_018f7bd2;
    }
    seqStore->lit = pBVar13 + uVar45;
    psVar18 = seqStore->sequences;
  }
  lVar41 = uVar39 + 4;
  psVar18->litLength = (U16)uVar45;
  psVar18->offBase = 1;
  uVar39 = uVar39 + 1;
  uVar45 = uVar44;
  goto joined_r0x018f7c7e;
LAB_018f79c5:
  puVar25 = (ulong *)((long)puVar43 + lVar41 + 0x10);
  if (puVar25 < puVar1) goto code_r0x018f79d4;
  puVar25 = (ulong *)((long)puVar37 + lVar41 + 0x10);
  puVar30 = (ulong *)((long)puVar43 + lVar41 + 0x10);
LAB_018f7f4a:
  if ((puVar30 < puVar2) && ((int)*puVar25 == (int)*puVar30)) {
    puVar30 = (ulong *)((long)puVar30 + 4);
    puVar25 = (ulong *)((long)puVar25 + 4);
  }
  if ((puVar30 < puVar3) && ((short)*puVar25 == (short)*puVar30)) {
    puVar30 = (ulong *)((long)puVar30 + 2);
    puVar25 = (ulong *)((long)puVar25 + 2);
  }
  if (puVar30 < puVar5) {
    puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar25 == (char)*puVar30));
  }
  uVar44 = (long)puVar30 - (long)puVar29;
  goto LAB_018f7f96;
code_r0x018f79d4:
  uVar44 = *(ulong *)((long)puVar37 + lVar41 + 0x10);
  uVar39 = *puVar25;
  lVar41 = lVar41 + 8;
  if (uVar44 != uVar39) goto code_r0x018f79e5;
  goto LAB_018f79c5;
code_r0x018f79e5:
  uVar39 = uVar39 ^ uVar44;
  uVar44 = 0;
  if (uVar39 != 0) {
    for (; (uVar39 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
    }
  }
  uVar44 = (uVar44 >> 3 & 0x1fffffff) + lVar41;
LAB_018f7f96:
  lVar41 = uVar44 + 8;
  uVar21 = iVar26 - (int)puVar37;
  if ((puVar28 < puVar37) && (src < puVar43)) {
    while( true ) {
      puVar37 = (ulong *)((long)puVar37 + -1);
      puVar29 = (ulong *)((long)puVar43 + -1);
      if (*(char *)puVar29 != *(char *)puVar37) break;
      lVar41 = lVar41 + 1;
      puVar43 = puVar29;
      if ((puVar29 <= src) || (puVar37 <= puVar28)) break;
    }
  }
LAB_018f817d:
  if (uVar46 < 4) {
    pUVar11[uVar33] = (int)puVar17 - iVar42;
  }
  uVar44 = (long)puVar43 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (puVar4 < puVar43) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar43,(BYTE *)puVar4);
LAB_018f81c1:
    seqStore->lit = seqStore->lit + uVar44;
    psVar18 = seqStore->sequences;
    if (0xffff < uVar44) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar39 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar39;
    pBVar13 = seqStore->lit;
    if (0x10 < uVar44) {
      uVar39 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar13 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar13 + 0x18) = uVar39;
      if (0x20 < (long)uVar44) {
        lVar34 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar34 + 0x20);
          uVar15 = puVar7[1];
          pBVar6 = pBVar13 + lVar34 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar15;
          puVar7 = (undefined8 *)((long)src + lVar34 + 0x30);
          uVar15 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar15;
          lVar34 = lVar34 + 0x20;
        } while (pBVar6 + 0x20 < pBVar13 + uVar44);
      }
      goto LAB_018f81c1;
    }
    seqStore->lit = pBVar13 + uVar44;
    psVar18 = seqStore->sequences;
  }
  psVar18->litLength = (U16)uVar44;
  psVar18->offBase = uVar21 + 3;
  uVar39 = lVar41 - 3;
joined_r0x018f7c7e:
  if (0xffff < uVar39) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
  }
  src = (void *)((long)puVar43 + lVar41);
  psVar18->mlBase = (U16)uVar39;
  seqStore->sequences = psVar18 + 1;
  if (puVar16 < src) {
    uVar44 = uVar45;
    uVar45 = (ulong)uVar21;
  }
  else {
    uVar38 = UVar32 + 2;
    lVar41 = *(long *)(pBVar10 + uVar38);
    pUVar11[(ulong)(lVar41 * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] = uVar38;
    pUVar11[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] =
         ((int)src + -2) - iVar42;
    pUVar12[(ulong)(lVar41 * -0x30e4432340650000) >> (bVar20 & 0x3f)] = uVar38;
    pUVar12[(ulong)(*(long *)((long)src + -1) * -0x30e4432340650000) >> (bVar20 & 0x3f)] =
         ((int)src + -1) - iVar42;
    uVar39 = uVar45;
    do {
      uVar33 = (ulong)uVar21;
      uVar21 = (uint)uVar39;
      uVar44 = uVar39;
      uVar45 = uVar33;
      if ((uVar21 == 0) || ((int)*src != *(int *)((long)src - uVar39))) break;
      lVar41 = -uVar39;
      puVar43 = (ulong *)((long)src + 4);
      puVar25 = (ulong *)((long)src + lVar41 + 4);
      puVar29 = puVar43;
      if (puVar43 < puVar1) {
        if (*puVar25 == *puVar43) {
          lVar34 = 0;
          do {
            puVar29 = (ulong *)((long)src + lVar34 + 0xc);
            if (puVar1 <= puVar29) {
              puVar25 = (ulong *)((long)src + lVar41 + lVar34 + 0xc);
              puVar29 = (ulong *)((long)src + lVar34 + 0xc);
              goto LAB_018f7de2;
            }
            uVar44 = *(ulong *)((long)src + lVar34 + lVar41 + 0xc);
            uVar45 = *puVar29;
            lVar34 = lVar34 + 8;
          } while (uVar44 == uVar45);
          uVar45 = uVar45 ^ uVar44;
          uVar44 = 0;
          if (uVar45 != 0) {
            for (; (uVar45 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
            }
          }
          uVar44 = (uVar44 >> 3 & 0x1fffffff) + lVar34;
        }
        else {
          uVar45 = *puVar43 ^ *puVar25;
          uVar44 = 0;
          if (uVar45 != 0) {
            for (; (uVar45 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
            }
          }
          uVar44 = uVar44 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_018f7de2:
        if ((puVar29 < puVar2) && ((int)*puVar25 == (int)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 4);
          puVar25 = (ulong *)((long)puVar25 + 4);
        }
        if ((puVar29 < puVar3) && ((short)*puVar25 == (short)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 2);
          puVar25 = (ulong *)((long)puVar25 + 2);
        }
        if (puVar29 < puVar5) {
          puVar29 = (ulong *)((long)puVar29 + (ulong)((char)*puVar25 == (char)*puVar29));
        }
        uVar44 = (long)puVar29 - (long)puVar43;
      }
      UVar32 = (int)src - iVar42;
      uVar45 = *src;
      pUVar12[uVar45 * -0x30e4432340650000 >> (bVar20 & 0x3f)] = UVar32;
      pUVar11[uVar45 * -0x30e44323485a9b9d >> (bVar19 & 0x3f)] = UVar32;
      puVar43 = (ulong *)seqStore->lit;
      if (puVar4 < src) {
        ZSTD_safecopyLiterals((BYTE *)puVar43,(BYTE *)src,(BYTE *)src,(BYTE *)puVar4);
      }
      else {
        uVar45 = *(ulong *)((long)src + 8);
        *puVar43 = *src;
        puVar43[1] = uVar45;
      }
      psVar18 = seqStore->sequences;
      psVar18->litLength = 0;
      psVar18->offBase = 1;
      if (0xffff < uVar44 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar18->mlBase = (U16)(uVar44 + 1);
      seqStore->sequences = psVar18 + 1;
      src = (void *)((long)src + uVar44 + 4);
      uVar44 = uVar33;
      uVar45 = uVar39;
      uVar39 = uVar33;
    } while (src <= puVar16);
  }
  puVar29 = (ulong *)((long)src + 1);
  uVar21 = (uint)uVar45;
  uVar38 = (uint)uVar44;
  puVar43 = (ulong *)src;
  if (puVar16 < puVar29) goto LAB_018f8d8d;
  goto LAB_018f77e1;
LAB_018f8fb5:
  puVar25 = (ulong *)((long)puVar43 + lVar34 + 0xd);
  if (puVar25 < puVar1) goto code_r0x018f8fc2;
  puVar37 = (ulong *)((long)puVar43 + lVar41 + lVar34 + 0xd);
  puVar25 = (ulong *)((long)puVar43 + lVar34 + 0xd);
LAB_018f918b:
  if ((puVar25 < puVar2) && ((int)*puVar37 == (int)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 4);
    puVar37 = (ulong *)((long)puVar37 + 4);
  }
  if ((puVar25 < puVar3) && ((short)*puVar37 == (short)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 2);
    puVar37 = (ulong *)((long)puVar37 + 2);
  }
  if (puVar25 < puVar5) {
    puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar37 == (char)*puVar25));
  }
  uVar39 = (long)puVar25 - (long)puVar29;
  goto LAB_018f91d5;
code_r0x018f8fc2:
  uVar39 = *(ulong *)((long)puVar43 + lVar34 + lVar41 + 0xd);
  uVar33 = *puVar25;
  lVar34 = lVar34 + 8;
  if (uVar39 != uVar33) goto code_r0x018f8fd2;
  goto LAB_018f8fb5;
code_r0x018f8fd2:
  uVar33 = uVar33 ^ uVar39;
  uVar39 = 0;
  if (uVar33 != 0) {
    for (; (uVar33 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
    }
  }
  uVar39 = (uVar39 >> 3 & 0x1fffffff) + lVar34;
LAB_018f91d5:
  puVar43 = (ulong *)((long)puVar43 + 1);
  uVar33 = (long)puVar43 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (puVar4 < puVar43) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar43,(BYTE *)puVar4);
LAB_018f9206:
    seqStore->lit = seqStore->lit + uVar33;
    psVar18 = seqStore->sequences;
    if (0xffff < uVar33) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar35 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar35;
    pBVar13 = seqStore->lit;
    if (0x10 < uVar33) {
      uVar35 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar13 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar13 + 0x18) = uVar35;
      if (0x20 < (long)uVar33) {
        lVar41 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar41 + 0x20);
          uVar15 = puVar7[1];
          pBVar6 = pBVar13 + lVar41 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar15;
          puVar7 = (undefined8 *)((long)src + lVar41 + 0x30);
          uVar15 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar15;
          lVar41 = lVar41 + 0x20;
        } while (pBVar6 + 0x20 < pBVar13 + uVar33);
      }
      goto LAB_018f9206;
    }
    seqStore->lit = pBVar13 + uVar33;
    psVar18 = seqStore->sequences;
  }
  lVar41 = uVar39 + 4;
  psVar18->litLength = (U16)uVar33;
  psVar18->offBase = 1;
  uVar39 = uVar39 + 1;
  goto joined_r0x018f92b1;
LAB_018f9026:
  puVar25 = (ulong *)((long)puVar43 + lVar41 + 0x10);
  if (puVar25 < puVar1) goto code_r0x018f9033;
  puVar25 = (ulong *)((long)puVar37 + lVar41 + 0x10);
  puVar30 = (ulong *)((long)puVar43 + lVar41 + 0x10);
LAB_018f9570:
  if ((puVar30 < puVar2) && ((int)*puVar25 == (int)*puVar30)) {
    puVar30 = (ulong *)((long)puVar30 + 4);
    puVar25 = (ulong *)((long)puVar25 + 4);
  }
  if ((puVar30 < puVar3) && ((short)*puVar25 == (short)*puVar30)) {
    puVar30 = (ulong *)((long)puVar30 + 2);
    puVar25 = (ulong *)((long)puVar25 + 2);
  }
  if (puVar30 < puVar5) {
    puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar25 == (char)*puVar30));
  }
  uVar44 = (long)puVar30 - (long)puVar29;
  goto LAB_018f95c4;
code_r0x018f9033:
  uVar44 = *(ulong *)((long)puVar37 + lVar41 + 0x10);
  uVar39 = *puVar25;
  lVar41 = lVar41 + 8;
  if (uVar44 != uVar39) goto code_r0x018f9044;
  goto LAB_018f9026;
code_r0x018f9044:
  uVar39 = uVar39 ^ uVar44;
  uVar44 = 0;
  if (uVar39 != 0) {
    for (; (uVar39 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
    }
  }
  uVar44 = (uVar44 >> 3 & 0x1fffffff) + lVar41;
LAB_018f95c4:
  lVar41 = uVar44 + 8;
  uVar40 = (long)puVar43 - (long)puVar37;
  if ((puVar28 < puVar37) && (src < puVar43)) {
    while( true ) {
      puVar37 = (ulong *)((long)puVar37 + -1);
      puVar29 = (ulong *)((long)puVar43 + -1);
      if (*(char *)puVar29 != *(char *)puVar37) break;
      lVar41 = lVar41 + 1;
      puVar43 = puVar29;
      if ((puVar29 <= src) || (puVar37 <= puVar28)) break;
    }
  }
LAB_018f97c3:
  if (uVar35 < 4) {
    pUVar11[uVar33] = (int)puVar17 - iVar42;
  }
  uVar44 = (long)puVar43 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (puVar4 < puVar43) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar43,(BYTE *)puVar4);
LAB_018f97fd:
    seqStore->lit = seqStore->lit + uVar44;
    psVar18 = seqStore->sequences;
    if (0xffff < uVar44) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar39 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar39;
    pBVar13 = seqStore->lit;
    if (0x10 < uVar44) {
      uVar39 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar13 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar13 + 0x18) = uVar39;
      if (0x20 < (long)uVar44) {
        lVar34 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar34 + 0x20);
          uVar15 = puVar7[1];
          pBVar6 = pBVar13 + lVar34 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar15;
          puVar7 = (undefined8 *)((long)src + lVar34 + 0x30);
          uVar15 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar15;
          lVar34 = lVar34 + 0x20;
        } while (pBVar6 + 0x20 < pBVar13 + uVar44);
      }
      goto LAB_018f97fd;
    }
    seqStore->lit = pBVar13 + uVar44;
    psVar18 = seqStore->sequences;
  }
  uVar21 = (uint)uVar40;
  psVar18->litLength = (U16)uVar44;
  psVar18->offBase = uVar21 + 3;
  uVar39 = lVar41 - 3;
  uVar44 = uVar45;
  uVar45 = uVar40 & 0xffffffff;
joined_r0x018f92b1:
  if (0xffff < uVar39) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
    uVar45 = (ulong)uVar21;
  }
  src = (void *)((long)puVar43 + lVar41);
  psVar18->mlBase = (U16)uVar39;
  seqStore->sequences = psVar18 + 1;
  if (src <= puVar16) {
    uVar38 = UVar32 + 2;
    pUVar11[(ulong)(*(long *)(pBVar10 + uVar38) * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] = uVar38;
    pUVar11[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] =
         ((int)src + -2) - iVar42;
    pUVar12[(uint)(*(int *)(pBVar10 + uVar38) * -0x61c8864f) >> (bVar20 & 0x1f)] = uVar38;
    pUVar12[(uint)(*(int *)((long)src + -1) * -0x61c8864f) >> (bVar20 & 0x1f)] =
         ((int)src + -1) - iVar42;
    uVar39 = uVar45;
    do {
      uVar33 = uVar44;
      uVar44 = uVar33;
      uVar45 = uVar39;
      if (((int)uVar33 == 0) || ((int)*src != *(int *)((long)src - uVar33))) break;
      lVar41 = -uVar33;
      puVar43 = (ulong *)((long)src + 4);
      puVar25 = (ulong *)((long)src + lVar41 + 4);
      puVar29 = puVar43;
      if (puVar43 < puVar1) {
        if (*puVar25 == *puVar43) {
          lVar34 = 0;
          do {
            puVar29 = (ulong *)((long)src + lVar34 + 0xc);
            if (puVar1 <= puVar29) {
              puVar25 = (ulong *)((long)src + lVar41 + lVar34 + 0xc);
              puVar29 = (ulong *)((long)src + lVar34 + 0xc);
              goto LAB_018f940c;
            }
            uVar44 = *(ulong *)((long)src + lVar34 + lVar41 + 0xc);
            uVar45 = *puVar29;
            lVar34 = lVar34 + 8;
          } while (uVar44 == uVar45);
          uVar45 = uVar45 ^ uVar44;
          uVar44 = 0;
          if (uVar45 != 0) {
            for (; (uVar45 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
            }
          }
          uVar44 = (uVar44 >> 3 & 0x1fffffff) + lVar34;
        }
        else {
          uVar45 = *puVar43 ^ *puVar25;
          uVar44 = 0;
          if (uVar45 != 0) {
            for (; (uVar45 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
            }
          }
          uVar44 = uVar44 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_018f940c:
        if ((puVar29 < puVar2) && ((int)*puVar25 == (int)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 4);
          puVar25 = (ulong *)((long)puVar25 + 4);
        }
        if ((puVar29 < puVar3) && ((short)*puVar25 == (short)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 2);
          puVar25 = (ulong *)((long)puVar25 + 2);
        }
        if (puVar29 < puVar5) {
          puVar29 = (ulong *)((long)puVar29 + (ulong)((char)*puVar25 == (char)*puVar29));
        }
        uVar44 = (long)puVar29 - (long)puVar43;
      }
      UVar32 = (int)src - iVar42;
      pUVar12[(uint)((int)*src * -0x61c8864f) >> (bVar20 & 0x1f)] = UVar32;
      pUVar11[*src * -0x30e44323485a9b9d >> (bVar19 & 0x3f)] = UVar32;
      puVar43 = (ulong *)seqStore->lit;
      if (puVar4 < src) {
        ZSTD_safecopyLiterals((BYTE *)puVar43,(BYTE *)src,(BYTE *)src,(BYTE *)puVar4);
      }
      else {
        uVar45 = *(ulong *)((long)src + 8);
        *puVar43 = *src;
        puVar43[1] = uVar45;
      }
      psVar18 = seqStore->sequences;
      psVar18->litLength = 0;
      psVar18->offBase = 1;
      if (0xffff < uVar44 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar18->mlBase = (U16)(uVar44 + 1);
      seqStore->sequences = psVar18 + 1;
      src = (void *)((long)src + uVar44 + 4);
      uVar44 = uVar39;
      uVar45 = uVar33;
      uVar39 = uVar33;
    } while (src <= puVar16);
  }
  puVar29 = (ulong *)((long)src + 1);
  uVar21 = (uint)uVar45;
  uVar38 = (uint)uVar44;
  puVar43 = (ulong *)src;
  if (puVar16 < puVar29) goto LAB_018f8d8d;
  goto LAB_018f8e5b;
LAB_018f6e42:
  puVar25 = (ulong *)((long)puVar43 + lVar34 + 0xd);
  if (puVar25 < puVar1) goto code_r0x018f6e51;
  puVar37 = (ulong *)((long)puVar43 + lVar41 + lVar34 + 0xd);
  puVar25 = (ulong *)((long)puVar43 + lVar34 + 0xd);
LAB_018f704d:
  if ((puVar25 < puVar2) && ((int)*puVar37 == (int)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 4);
    puVar37 = (ulong *)((long)puVar37 + 4);
  }
  if ((puVar25 < puVar3) && ((short)*puVar37 == (short)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 2);
    puVar37 = (ulong *)((long)puVar37 + 2);
  }
  if (puVar25 < puVar5) {
    puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar37 == (char)*puVar25));
  }
  uVar39 = (long)puVar25 - (long)puVar29;
  goto LAB_018f7094;
code_r0x018f6e51:
  uVar45 = *(ulong *)((long)puVar43 + lVar34 + lVar41 + 0xd);
  uVar39 = *puVar25;
  lVar34 = lVar34 + 8;
  if (uVar45 != uVar39) goto code_r0x018f6e61;
  goto LAB_018f6e42;
code_r0x018f6e61:
  uVar39 = uVar39 ^ uVar45;
  uVar45 = 0;
  if (uVar39 != 0) {
    for (; (uVar39 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
    }
  }
  uVar39 = (uVar45 >> 3 & 0x1fffffff) + lVar34;
LAB_018f7094:
  puVar43 = (ulong *)((long)puVar43 + 1);
  uVar45 = (long)puVar43 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (puVar4 < puVar43) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar43,(BYTE *)puVar4);
LAB_018f70c7:
    seqStore->lit = seqStore->lit + uVar45;
    psVar18 = seqStore->sequences;
    if (0xffff < uVar45) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar33 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar33;
    pBVar13 = seqStore->lit;
    if (0x10 < uVar45) {
      uVar33 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar13 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar13 + 0x18) = uVar33;
      if (0x20 < (long)uVar45) {
        lVar41 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar41 + 0x20);
          uVar15 = puVar7[1];
          pBVar6 = pBVar13 + lVar41 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar15;
          puVar7 = (undefined8 *)((long)src + lVar41 + 0x30);
          uVar15 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar15;
          lVar41 = lVar41 + 0x20;
        } while (pBVar6 + 0x20 < pBVar13 + uVar45);
      }
      goto LAB_018f70c7;
    }
    seqStore->lit = pBVar13 + uVar45;
    psVar18 = seqStore->sequences;
  }
  lVar41 = uVar39 + 4;
  psVar18->litLength = (U16)uVar45;
  psVar18->offBase = 1;
  uVar39 = uVar39 + 1;
  uVar45 = uVar44;
  goto joined_r0x018f7173;
LAB_018f6eba:
  puVar25 = (ulong *)((long)puVar43 + lVar41 + 0x10);
  if (puVar25 < puVar1) goto code_r0x018f6ec9;
  puVar25 = (ulong *)((long)puVar37 + lVar41 + 0x10);
  puVar30 = (ulong *)((long)puVar43 + lVar41 + 0x10);
LAB_018f743f:
  if ((puVar30 < puVar2) && ((int)*puVar25 == (int)*puVar30)) {
    puVar30 = (ulong *)((long)puVar30 + 4);
    puVar25 = (ulong *)((long)puVar25 + 4);
  }
  if ((puVar30 < puVar3) && ((short)*puVar25 == (short)*puVar30)) {
    puVar30 = (ulong *)((long)puVar30 + 2);
    puVar25 = (ulong *)((long)puVar25 + 2);
  }
  if (puVar30 < puVar5) {
    puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar25 == (char)*puVar30));
  }
  uVar44 = (long)puVar30 - (long)puVar29;
  goto LAB_018f748b;
code_r0x018f6ec9:
  uVar44 = *(ulong *)((long)puVar37 + lVar41 + 0x10);
  uVar39 = *puVar25;
  lVar41 = lVar41 + 8;
  if (uVar44 != uVar39) goto code_r0x018f6eda;
  goto LAB_018f6eba;
code_r0x018f6eda:
  uVar39 = uVar39 ^ uVar44;
  uVar44 = 0;
  if (uVar39 != 0) {
    for (; (uVar39 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
    }
  }
  uVar44 = (uVar44 >> 3 & 0x1fffffff) + lVar41;
LAB_018f748b:
  lVar41 = uVar44 + 8;
  uVar21 = iVar26 - (int)puVar37;
  if ((puVar28 < puVar37) && (src < puVar43)) {
    while( true ) {
      puVar37 = (ulong *)((long)puVar37 + -1);
      puVar29 = (ulong *)((long)puVar43 + -1);
      if (*(char *)puVar29 != *(char *)puVar37) break;
      lVar41 = lVar41 + 1;
      puVar43 = puVar29;
      if ((puVar29 <= src) || (puVar37 <= puVar28)) break;
    }
  }
LAB_018f7672:
  if (uVar46 < 4) {
    pUVar11[uVar33] = (int)puVar17 - iVar42;
  }
  uVar44 = (long)puVar43 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (puVar4 < puVar43) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar43,(BYTE *)puVar4);
LAB_018f76b6:
    seqStore->lit = seqStore->lit + uVar44;
    psVar18 = seqStore->sequences;
    if (0xffff < uVar44) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar39 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar39;
    pBVar13 = seqStore->lit;
    if (0x10 < uVar44) {
      uVar39 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar13 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar13 + 0x18) = uVar39;
      if (0x20 < (long)uVar44) {
        lVar34 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar34 + 0x20);
          uVar15 = puVar7[1];
          pBVar6 = pBVar13 + lVar34 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar15;
          puVar7 = (undefined8 *)((long)src + lVar34 + 0x30);
          uVar15 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar15;
          lVar34 = lVar34 + 0x20;
        } while (pBVar6 + 0x20 < pBVar13 + uVar44);
      }
      goto LAB_018f76b6;
    }
    seqStore->lit = pBVar13 + uVar44;
    psVar18 = seqStore->sequences;
  }
  psVar18->litLength = (U16)uVar44;
  psVar18->offBase = uVar21 + 3;
  uVar39 = lVar41 - 3;
joined_r0x018f7173:
  if (0xffff < uVar39) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
  }
  src = (void *)((long)puVar43 + lVar41);
  psVar18->mlBase = (U16)uVar39;
  seqStore->sequences = psVar18 + 1;
  if (puVar16 < src) {
    uVar44 = uVar45;
    uVar45 = (ulong)uVar21;
  }
  else {
    uVar38 = UVar32 + 2;
    lVar41 = *(long *)(pBVar10 + uVar38);
    pUVar11[(ulong)(lVar41 * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] = uVar38;
    pUVar11[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] =
         ((int)src + -2) - iVar42;
    pUVar12[(ulong)(lVar41 * -0x30e44323405a9d00) >> (bVar20 & 0x3f)] = uVar38;
    pUVar12[(ulong)(*(long *)((long)src + -1) * -0x30e44323405a9d00) >> (bVar20 & 0x3f)] =
         ((int)src + -1) - iVar42;
    uVar39 = uVar45;
    do {
      uVar33 = (ulong)uVar21;
      uVar21 = (uint)uVar39;
      uVar44 = uVar39;
      uVar45 = uVar33;
      if ((uVar21 == 0) || ((int)*src != *(int *)((long)src - uVar39))) break;
      lVar41 = -uVar39;
      puVar43 = (ulong *)((long)src + 4);
      puVar25 = (ulong *)((long)src + lVar41 + 4);
      puVar29 = puVar43;
      if (puVar43 < puVar1) {
        if (*puVar25 == *puVar43) {
          lVar34 = 0;
          do {
            puVar29 = (ulong *)((long)src + lVar34 + 0xc);
            if (puVar1 <= puVar29) {
              puVar25 = (ulong *)((long)src + lVar41 + lVar34 + 0xc);
              puVar29 = (ulong *)((long)src + lVar34 + 0xc);
              goto LAB_018f72d7;
            }
            uVar44 = *(ulong *)((long)src + lVar34 + lVar41 + 0xc);
            uVar45 = *puVar29;
            lVar34 = lVar34 + 8;
          } while (uVar44 == uVar45);
          uVar45 = uVar45 ^ uVar44;
          uVar44 = 0;
          if (uVar45 != 0) {
            for (; (uVar45 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
            }
          }
          uVar44 = (uVar44 >> 3 & 0x1fffffff) + lVar34;
        }
        else {
          uVar45 = *puVar43 ^ *puVar25;
          uVar44 = 0;
          if (uVar45 != 0) {
            for (; (uVar45 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
            }
          }
          uVar44 = uVar44 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_018f72d7:
        if ((puVar29 < puVar2) && ((int)*puVar25 == (int)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 4);
          puVar25 = (ulong *)((long)puVar25 + 4);
        }
        if ((puVar29 < puVar3) && ((short)*puVar25 == (short)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 2);
          puVar25 = (ulong *)((long)puVar25 + 2);
        }
        if (puVar29 < puVar5) {
          puVar29 = (ulong *)((long)puVar29 + (ulong)((char)*puVar25 == (char)*puVar29));
        }
        uVar44 = (long)puVar29 - (long)puVar43;
      }
      UVar32 = (int)src - iVar42;
      uVar45 = *src;
      pUVar12[uVar45 * -0x30e44323405a9d00 >> (bVar20 & 0x3f)] = UVar32;
      pUVar11[uVar45 * -0x30e44323485a9b9d >> (bVar19 & 0x3f)] = UVar32;
      puVar43 = (ulong *)seqStore->lit;
      if (puVar4 < src) {
        ZSTD_safecopyLiterals((BYTE *)puVar43,(BYTE *)src,(BYTE *)src,(BYTE *)puVar4);
      }
      else {
        uVar45 = *(ulong *)((long)src + 8);
        *puVar43 = *src;
        puVar43[1] = uVar45;
      }
      psVar18 = seqStore->sequences;
      psVar18->litLength = 0;
      psVar18->offBase = 1;
      if (0xffff < uVar44 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar18->mlBase = (U16)(uVar44 + 1);
      seqStore->sequences = psVar18 + 1;
      src = (void *)((long)src + uVar44 + 4);
      uVar44 = uVar33;
      uVar45 = uVar39;
      uVar39 = uVar33;
    } while (src <= puVar16);
  }
  puVar29 = (ulong *)((long)src + 1);
  uVar21 = (uint)uVar45;
  uVar38 = (uint)uVar44;
  puVar43 = (ulong *)src;
  if (puVar16 < puVar29) goto LAB_018f8d8d;
  goto LAB_018f6cd6;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_noDict_4(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_doubleFast_noDict_5(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_doubleFast_noDict_6(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_doubleFast_noDict_7(ms, seqStore, rep, src, srcSize);
    }
}